

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoSystem.h
# Opt level: O3

void __thiscall KDIS::PDU::Transmitter_PDU::SetCryptoSystem(Transmitter_PDU *this,CryptoSystem *CS)

{
  anon_union_2_2_87a8692b_for_CryptoSystem_2 aVar1;
  
  aVar1 = CS->field_1;
  (this->m_CryptoSystem).m_ui16CryptoSystemType = CS->m_ui16CryptoSystemType;
  (this->m_CryptoSystem).field_1 = aVar1;
  return;
}

Assistant:

class KDIS_EXPORT CryptoSystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16CryptoSystemType;

    union
    {
        struct
        {
            KUINT16 m_ui16EncryptionMode : 1;
            KUINT16 m_ui16KeyID          : 15;
        };

        KUINT16 m_ui16CryptoKey;
    };

public:

    static const KUINT16 CRYPTO_SYSTEM_SIZE = 4;

    CryptoSystem();

    CryptoSystem(KDataStream &stream) noexcept(false);

    CryptoSystem( KDIS::DATA_TYPE::ENUMS::CryptoSystemType CST, KDIS::DATA_TYPE::ENUMS::EncryptionMode EM, KUINT16 Key );

    virtual ~CryptoSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::SetCryptoSystemType
    //              KDIS::DATA_TYPE::CryptoSystem::GetCryptoSystemType
    // Description: Equipment being used.
    // Parameter:   CryptoSystemType T
    //************************************
    void SetCryptoSystemType( KDIS::DATA_TYPE::ENUMS::CryptoSystemType T );
    KDIS::DATA_TYPE::ENUMS::CryptoSystemType GetCryptoSystemType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::SetEncryptionMode
    //              KDIS::DATA_TYPE::CryptoSystem::GetEncryptionMode
    // Description: Mode being used to encrypt the data.
    // Parameter:   EncryptionMode EM
    //************************************
    void SetEncryptionMode( KDIS::DATA_TYPE::ENUMS::EncryptionMode EM );
    KDIS::DATA_TYPE::ENUMS::EncryptionMode GetEncryptionMode() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::SetKeyID
    //              KDIS::DATA_TYPE::CryptoSystem::GetKeyID
    // Description: Mode being used to encrypt the data.
    // Parameter:   EncryptionMode EM
    //************************************
    void SetKeyID( KUINT16 KeyID );
    KUINT16 GetKeyID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::SetKey
    //              KDIS::DATA_TYPE::CryptoSystem::GetKey
    // Description: Key. Not an actual crypto key, if the key
    //              from the sender is the same as the key of the
    //              receiver then they are considered to be using the
    //              same key.
    // Parameter:   KUINT16 EM
    //************************************
    void SetKey( KUINT16 K );
    KUINT16 GetKey() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::CryptoSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const CryptoSystem & Value ) const;
    KBOOL operator != ( const CryptoSystem & Value ) const;
}